

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_depth_stencil_state
          (Impl *this,Value *ds,VkPipelineDepthStencilStateCreateInfo **out_info)

{
  double dVar1;
  bool bVar2;
  VkPipelineDepthStencilStateCreateInfo *pVVar3;
  Type pGVar4;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar5;
  Number NVar6;
  undefined8 local_30;
  
  pVVar3 = (VkPipelineDepthStencilStateCreateInfo *)
           ScratchAllocator::allocate_raw(&this->allocator,0x68,0x10);
  if (pVVar3 != (VkPipelineDepthStencilStateCreateInfo *)0x0) {
    (pVVar3->back).compareMask = 0;
    (pVVar3->back).writeMask = 0;
    *(undefined8 *)&(pVVar3->back).reference = 0;
    (pVVar3->back).failOp = VK_STENCIL_OP_KEEP;
    (pVVar3->back).passOp = VK_STENCIL_OP_KEEP;
    (pVVar3->back).depthFailOp = VK_STENCIL_OP_KEEP;
    (pVVar3->back).compareOp = VK_COMPARE_OP_NEVER;
    (pVVar3->front).compareOp = VK_COMPARE_OP_NEVER;
    (pVVar3->front).compareMask = 0;
    (pVVar3->front).writeMask = 0;
    (pVVar3->front).reference = 0;
    pVVar3->stencilTestEnable = 0;
    (pVVar3->front).failOp = VK_STENCIL_OP_KEEP;
    (pVVar3->front).passOp = VK_STENCIL_OP_KEEP;
    (pVVar3->front).depthFailOp = VK_STENCIL_OP_KEEP;
    pVVar3->depthTestEnable = 0;
    pVVar3->depthWriteEnable = 0;
    pVVar3->depthCompareOp = VK_COMPARE_OP_NEVER;
    pVVar3->depthBoundsTestEnable = 0;
    *(undefined8 *)&pVVar3->field_0x4 = 0;
    *(undefined8 *)((long)&pVVar3->pNext + 4) = 0;
    pVVar3->maxDepthBounds = 0.0;
  }
  pVVar3->sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)ds,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar3->flags = (pGVar4->data_).s.length;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)ds,"depthBoundsTestEnable");
    if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3->depthBoundsTestEnable = (pGVar4->data_).s.length;
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)ds,"depthCompareOp");
      if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar3->depthCompareOp = (pGVar4->data_).s.length;
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)ds,"depthTestEnable");
        if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000)
            != (undefined1  [16])0x0) {
          pVVar3->depthTestEnable = (pGVar4->data_).s.length;
          pGVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)ds,"depthWriteEnable");
          if ((undefined1  [16])
              ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
              (undefined1  [16])0x0) {
            pVVar3->depthWriteEnable = (pGVar4->data_).s.length;
            pGVar4 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)ds,"minDepthBounds");
            dVar1 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetDouble(pGVar4);
            pVVar3->minDepthBounds = (float)dVar1;
            pGVar4 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)ds,"maxDepthBounds");
            dVar1 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetDouble(pGVar4);
            pVVar3->maxDepthBounds = (float)dVar1;
            pGVar4 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                     ::operator[]<char_const>
                               ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 *)ds,"stencilTestEnable");
            if ((undefined1  [16])
                ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
                (undefined1  [16])0x0) {
              pVVar3->stencilTestEnable = (pGVar4->data_).s.length;
              pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)rapidjson::
                          GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          ::operator[]<char_const>
                                    ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                      *)ds,"front");
              pGVar4 = rapidjson::
                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       ::operator[]<char_const>(pGVar5,"compareMask");
              if ((undefined1  [16])
                  ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
                  (undefined1  [16])0x0) {
                (pVVar3->front).compareMask = (pGVar4->data_).s.length;
                pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)rapidjson::
                            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            ::operator[]<char_const>
                                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                        *)ds,"front");
                pGVar4 = rapidjson::
                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         ::operator[]<char_const>(pGVar5,"compareOp");
                if ((undefined1  [16])
                    ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
                    (undefined1  [16])0x0) {
                  (pVVar3->front).compareOp = (pGVar4->data_).s.length;
                  pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)rapidjson::
                              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              ::operator[]<char_const>
                                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                          *)ds,"front");
                  pGVar4 = rapidjson::
                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           ::operator[]<char_const>(pGVar5,"depthFailOp");
                  if ((undefined1  [16])
                      ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
                      (undefined1  [16])0x0) {
                    (pVVar3->front).depthFailOp = (pGVar4->data_).s.length;
                    pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)rapidjson::
                                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                ::operator[]<char_const>
                                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                            *)ds,"front");
                    pGVar4 = rapidjson::
                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             ::operator[]<char_const>(pGVar5,"passOp");
                    if ((undefined1  [16])
                        ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
                        (undefined1  [16])0x0) {
                      (pVVar3->front).passOp = (pGVar4->data_).s.length;
                      pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                *)rapidjson::
                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  ::operator[]<char_const>
                                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                              *)ds,"front");
                      pGVar4 = rapidjson::
                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               ::operator[]<char_const>(pGVar5,"failOp");
                      if ((undefined1  [16])
                          ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
                          (undefined1  [16])0x0) {
                        (pVVar3->front).failOp = (pGVar4->data_).s.length;
                        pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                  *)rapidjson::
                                    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                    ::operator[]<char_const>
                                              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                *)ds,"front");
                        pGVar4 = rapidjson::
                                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                 ::operator[]<char_const>(pGVar5,"reference");
                        if ((undefined1  [16])
                            ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000)
                            != (undefined1  [16])0x0) {
                          (pVVar3->front).reference = (pGVar4->data_).s.length;
                          pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                    *)rapidjson::
                                      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                      ::operator[]<char_const>
                                                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)ds,"front");
                          pGVar4 = rapidjson::
                                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                   ::operator[]<char_const>(pGVar5,"writeMask");
                          if ((undefined1  [16])
                              ((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000)
                              != (undefined1  [16])0x0) {
                            (pVVar3->front).writeMask = (pGVar4->data_).s.length;
                            pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                      *)rapidjson::
                                        GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                        ::operator[]<char_const>
                                                  ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)ds,"back");
                            pGVar4 = rapidjson::
                                     GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                     ::operator[]<char_const>(pGVar5,"compareMask");
                            if ((undefined1  [16])
                                ((undefined1  [16])pGVar4->data_ &
                                (undefined1  [16])0x40000000000000) != (undefined1  [16])0x0) {
                              (pVVar3->back).compareMask = (pGVar4->data_).s.length;
                              pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                        *)rapidjson::
                                          GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                          ::operator[]<char_const>
                                                    ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)ds,"back");
                              pGVar4 = rapidjson::
                                       GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                       ::operator[]<char_const>(pGVar5,"compareOp");
                              if ((undefined1  [16])
                                  ((undefined1  [16])pGVar4->data_ &
                                  (undefined1  [16])0x40000000000000) != (undefined1  [16])0x0) {
                                (pVVar3->back).compareOp = (pGVar4->data_).s.length;
                                pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                          *)rapidjson::
                                            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                            ::operator[]<char_const>
                                                      ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)ds,"back");
                                pGVar4 = rapidjson::
                                         GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                         ::operator[]<char_const>(pGVar5,"depthFailOp");
                                if ((undefined1  [16])
                                    ((undefined1  [16])pGVar4->data_ &
                                    (undefined1  [16])0x40000000000000) != (undefined1  [16])0x0) {
                                  (pVVar3->back).depthFailOp = (pGVar4->data_).s.length;
                                  pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                            *)rapidjson::
                                              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                              ::operator[]<char_const>
                                                        ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)ds,"back");
                                  pGVar4 = rapidjson::
                                           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                           ::operator[]<char_const>(pGVar5,"passOp");
                                  if ((undefined1  [16])
                                      ((undefined1  [16])pGVar4->data_ &
                                      (undefined1  [16])0x40000000000000) != (undefined1  [16])0x0)
                                  {
                                    (pVVar3->back).passOp = (pGVar4->data_).s.length;
                                    pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                              *)rapidjson::
                                                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                ::operator[]<char_const>
                                                          ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)ds,"back");
                                    pGVar4 = rapidjson::
                                             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                             ::operator[]<char_const>(pGVar5,"failOp");
                                    if ((undefined1  [16])
                                        ((undefined1  [16])pGVar4->data_ &
                                        (undefined1  [16])0x40000000000000) != (undefined1  [16])0x0
                                       ) {
                                      (pVVar3->back).failOp = (pGVar4->data_).s.length;
                                      pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                *)rapidjson::
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)ds,"back");
                                      pGVar4 = rapidjson::
                                               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                               ::operator[]<char_const>(pGVar5,"reference");
                                      if ((undefined1  [16])
                                          ((undefined1  [16])pGVar4->data_ &
                                          (undefined1  [16])0x40000000000000) !=
                                          (undefined1  [16])0x0) {
                                        (pVVar3->back).reference = (pGVar4->data_).s.length;
                                        pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)rapidjson::
                                                                                                        
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)ds,"back");
                                        pGVar4 = rapidjson::
                                                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                 ::operator[]<char_const>(pGVar5,"writeMask");
                                        if ((undefined1  [16])
                                            ((undefined1  [16])pGVar4->data_ &
                                            (undefined1  [16])0x40000000000000) !=
                                            (undefined1  [16])0x0) {
                                          (pVVar3->back).writeMask = (pGVar4->data_).s.length;
                                          rapidjson::
                                          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                          ::FindMember((
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  *)&stack0xffffffffffffffd0,(Ch *)ds);
                                          NVar6.i = (I)rapidjson::
                                                                                                              
                                                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                                  ::MemberEnd(ds);
                                          if (local_30 != NVar6.i64) {
                                            pGVar4 = rapidjson::
                                                                                                          
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  ::operator[]<char_const>
                                                            ((
                                                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                                                  *)ds,"pNext");
                                            bVar2 = parse_pnext_chain(this,pGVar4,&pVVar3->pNext,
                                                                      (StateCreatorInterface *)0x0,
                                                                      (DatabaseInterface *)0x0,
                                                                      (Value *)0x0);
                                            if (!bVar2) {
                                              return false;
                                            }
                                          }
                                          *out_info = pVVar3;
                                          return true;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_depth_stencil_state(const Value &ds, const VkPipelineDepthStencilStateCreateInfo **out_info)
{
	auto *state = allocator.allocate_cleared<VkPipelineDepthStencilStateCreateInfo>();
	state->sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
	state->flags = ds["flags"].GetUint();

	state->depthBoundsTestEnable = ds["depthBoundsTestEnable"].GetUint();
	state->depthCompareOp = static_cast<VkCompareOp>(ds["depthCompareOp"].GetUint());
	state->depthTestEnable = ds["depthTestEnable"].GetUint();
	state->depthWriteEnable = ds["depthWriteEnable"].GetUint();
	state->minDepthBounds = ds["minDepthBounds"].GetFloat();
	state->maxDepthBounds = ds["maxDepthBounds"].GetFloat();
	state->stencilTestEnable = ds["stencilTestEnable"].GetUint();
	state->front.compareMask = ds["front"]["compareMask"].GetUint();
	state->front.compareOp = static_cast<VkCompareOp>(ds["front"]["compareOp"].GetUint());
	state->front.depthFailOp = static_cast<VkStencilOp>(ds["front"]["depthFailOp"].GetUint());
	state->front.passOp = static_cast<VkStencilOp>(ds["front"]["passOp"].GetUint());
	state->front.failOp = static_cast<VkStencilOp>(ds["front"]["failOp"].GetUint());
	state->front.reference = ds["front"]["reference"].GetUint();
	state->front.writeMask = ds["front"]["writeMask"].GetUint();
	state->back.compareMask = ds["back"]["compareMask"].GetUint();
	state->back.compareOp = static_cast<VkCompareOp>(ds["back"]["compareOp"].GetUint());
	state->back.depthFailOp = static_cast<VkStencilOp>(ds["back"]["depthFailOp"].GetUint());
	state->back.passOp = static_cast<VkStencilOp>(ds["back"]["passOp"].GetUint());
	state->back.failOp = static_cast<VkStencilOp>(ds["back"]["failOp"].GetUint());
	state->back.reference = ds["back"]["reference"].GetUint();
	state->back.writeMask = ds["back"]["writeMask"].GetUint();

	if (ds.HasMember("pNext"))
		if (!parse_pnext_chain(ds["pNext"], &state->pNext))
			return false;

	*out_info = state;
	return true;
}